

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.cpp
# Opt level: O1

void SetCost(uint32_t *histogram,size_t histogram_size,int literal_histogram,float *cost)

{
  size_t sVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  if (histogram_size == 0) {
    uVar2 = 0;
  }
  else {
    sVar1 = 0;
    uVar2 = 0;
    do {
      uVar2 = uVar2 + histogram[sVar1];
      sVar1 = sVar1 + 1;
    } while (histogram_size != sVar1);
  }
  if (uVar2 < 0x100) {
    dVar3 = (double)(&duckdb_brotli::kBrotliLog2Table)[uVar2];
  }
  else {
    auVar6._8_4_ = (int)(uVar2 >> 0x20);
    auVar6._0_8_ = uVar2;
    auVar6._12_4_ = 0x45300000;
    dVar3 = log2((auVar6._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0));
  }
  if (histogram_size != 0 && literal_histogram == 0) {
    sVar1 = 0;
    do {
      uVar2 = uVar2 + (histogram[sVar1] == 0);
      sVar1 = sVar1 + 1;
    } while (histogram_size != sVar1);
  }
  if (uVar2 < 0x100) {
    dVar4 = (double)(&duckdb_brotli::kBrotliLog2Table)[uVar2];
  }
  else {
    auVar7._8_4_ = (int)(uVar2 >> 0x20);
    auVar7._0_8_ = uVar2;
    auVar7._12_4_ = 0x45300000;
    dVar4 = log2((auVar7._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0));
  }
  if (histogram_size != 0) {
    sVar1 = 0;
    do {
      uVar2 = (ulong)histogram[sVar1];
      if (uVar2 == 0) {
        cost[sVar1] = (float)dVar4 + 2.0;
      }
      else {
        if (histogram[sVar1] < 0x100) {
          dVar5 = (double)(&duckdb_brotli::kBrotliLog2Table)[uVar2];
        }
        else {
          dVar5 = log2((double)uVar2);
        }
        cost[sVar1] = (float)dVar3 - (float)dVar5;
        if ((float)dVar3 - (float)dVar5 < 1.0) {
          cost[sVar1] = 1.0;
        }
      }
      sVar1 = sVar1 + 1;
    } while (histogram_size != sVar1);
  }
  return;
}

Assistant:

static void SetCost(const uint32_t* histogram, size_t histogram_size,
                    BROTLI_BOOL literal_histogram, float* cost) {
  size_t sum = 0;
  size_t missing_symbol_sum;
  float log2sum;
  float missing_symbol_cost;
  size_t i;
  for (i = 0; i < histogram_size; i++) {
    sum += histogram[i];
  }
  log2sum = (float)FastLog2(sum);
  missing_symbol_sum = sum;
  if (!literal_histogram) {
    for (i = 0; i < histogram_size; i++) {
      if (histogram[i] == 0) missing_symbol_sum++;
    }
  }
  missing_symbol_cost = (float)FastLog2(missing_symbol_sum) + 2;
  for (i = 0; i < histogram_size; i++) {
    if (histogram[i] == 0) {
      cost[i] = missing_symbol_cost;
      continue;
    }

    /* Shannon bits for this symbol. */
    cost[i] = log2sum - (float)FastLog2(histogram[i]);

    /* Cannot be coded with less than 1 bit */
    if (cost[i] < 1) cost[i] = 1;
  }
}